

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

int __thiscall
WavingSketch<8U,_1U,_4U>::Bucket::Query
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool only_heavy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined3 in_register_00000081;
  
  uVar2 = 0;
  if (CONCAT31(in_register_00000081,only_heavy) == 0) {
    uVar2 = (*(int *)item->str * 0x16a88000 | (uint)(*(int *)item->str * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ seed_s;
    uVar2 = (uVar2 >> 0x13 | uVar2 << 0xd) * 5 + 0xe6546b64;
    uVar2 = (uVar2 >> 0x10 ^ uVar2 ^ 4) * -0x7a143595;
    uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
    uVar2 = (int)this->incast[0] * COUNT[(uVar2 >> 0x10 ^ uVar2) & 1];
    uVar2 = ~((int)uVar2 >> 0x1f) & uVar2;
  }
  lVar4 = 0;
  do {
    if (*(int *)(this->items[0].str + lVar4) == *(int *)item->str) {
      iVar1 = *(int *)((long)this->counters + lVar4);
      iVar3 = -iVar1;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      return iVar3;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x20);
  return uVar2;
}

Assistant:

int Query(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool only_heavy = false) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type retv = (only_heavy == true) ? 0 : std::max(incast[whichcast] * COUNT[choice], 0);

			for (uint32_t i = 0; i < slot_num; ++i) {
				if (items[i] == item) {
					return std::abs(counters[i]);
				}
			}
			return retv;
		}